

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_dirread.c
# Opt level: O0

TIFFReadDirEntryErr TIFFReadDirEntrySshort(TIFF *tif,TIFFDirEntry *direntry,int16_t *value)

{
  int64_t local_48;
  int64_t m_6;
  uint64_t m_5;
  int32_t m_4;
  uint32_t m_3;
  uint16_t m_2;
  int8_t m_1;
  uint8_t m;
  TIFFReadDirEntryErr err;
  int16_t *value_local;
  TIFFDirEntry *direntry_local;
  TIFF *tif_local;
  
  if (direntry->tdir_count == 1) {
    _m_2 = (ushort *)value;
    value_local = (int16_t *)direntry;
    direntry_local = (TIFFDirEntry *)tif;
    switch(direntry->tdir_type) {
    case 1:
      TIFFReadDirEntryCheckedByte(tif,direntry,(uint8_t *)((long)&m_4 + 3));
      *_m_2 = (ushort)m_4._3_1_;
      tif_local._4_4_ = TIFFReadDirEntryErrOk;
      break;
    default:
      tif_local._4_4_ = TIFFReadDirEntryErrType;
      break;
    case 3:
      TIFFReadDirEntryCheckedShort(tif,direntry,(uint16_t *)&m_4);
      tif_local._4_4_ = TIFFReadDirEntryCheckRangeSshortShort((uint16_t)m_4);
      if (tif_local._4_4_ == TIFFReadDirEntryErrOk) {
        *_m_2 = (uint16_t)m_4;
        tif_local._4_4_ = TIFFReadDirEntryErrOk;
      }
      break;
    case 4:
      TIFFReadDirEntryCheckedLong(tif,direntry,(uint32_t *)((long)&m_5 + 4));
      tif_local._4_4_ = TIFFReadDirEntryCheckRangeSshortLong(m_5._4_4_);
      if (tif_local._4_4_ == TIFFReadDirEntryErrOk) {
        *_m_2 = (int16_t)m_5._4_4_;
        tif_local._4_4_ = TIFFReadDirEntryErrOk;
      }
      break;
    case 6:
      TIFFReadDirEntryCheckedSbyte(tif,direntry,(int8_t *)((long)&m_4 + 2));
      *_m_2 = (short)m_4._2_1_;
      tif_local._4_4_ = TIFFReadDirEntryErrOk;
      break;
    case 8:
      TIFFReadDirEntryCheckedSshort(tif,direntry,value);
      tif_local._4_4_ = TIFFReadDirEntryErrOk;
      break;
    case 9:
      TIFFReadDirEntryCheckedSlong(tif,direntry,(int32_t *)&m_5);
      tif_local._4_4_ = TIFFReadDirEntryCheckRangeSshortSlong((int32_t)m_5);
      if (tif_local._4_4_ == TIFFReadDirEntryErrOk) {
        *_m_2 = (int16_t)(int32_t)m_5;
        tif_local._4_4_ = TIFFReadDirEntryErrOk;
      }
      break;
    case 0x10:
      m_3 = TIFFReadDirEntryCheckedLong8(tif,direntry,(uint64_t *)&m_6);
      tif_local._4_4_ = m_3;
      if ((m_3 == TIFFReadDirEntryErrOk) &&
         (tif_local._4_4_ = TIFFReadDirEntryCheckRangeSshortLong8(m_6),
         tif_local._4_4_ == TIFFReadDirEntryErrOk)) {
        *_m_2 = (int16_t)m_6;
        tif_local._4_4_ = TIFFReadDirEntryErrOk;
      }
      break;
    case 0x11:
      m_3 = TIFFReadDirEntryCheckedSlong8(tif,direntry,&local_48);
      tif_local._4_4_ = m_3;
      if ((m_3 == TIFFReadDirEntryErrOk) &&
         (tif_local._4_4_ = TIFFReadDirEntryCheckRangeSshortSlong8(local_48),
         tif_local._4_4_ == TIFFReadDirEntryErrOk)) {
        *_m_2 = (int16_t)local_48;
        tif_local._4_4_ = TIFFReadDirEntryErrOk;
      }
    }
  }
  else {
    tif_local._4_4_ = TIFFReadDirEntryErrCount;
  }
  return tif_local._4_4_;
}

Assistant:

static enum TIFFReadDirEntryErr
TIFFReadDirEntrySshort(TIFF *tif, TIFFDirEntry *direntry, int16_t *value)
{
    enum TIFFReadDirEntryErr err;
    if (direntry->tdir_count != 1)
        return (TIFFReadDirEntryErrCount);
    switch (direntry->tdir_type)
    {
        case TIFF_BYTE:
        {
            uint8_t m;
            TIFFReadDirEntryCheckedByte(tif, direntry, &m);
            *value = (int16_t)m;
            return (TIFFReadDirEntryErrOk);
        }
        case TIFF_SBYTE:
        {
            int8_t m;
            TIFFReadDirEntryCheckedSbyte(tif, direntry, &m);
            *value = (int16_t)m;
            return (TIFFReadDirEntryErrOk);
        }
        case TIFF_SHORT:
        {
            uint16_t m;
            TIFFReadDirEntryCheckedShort(tif, direntry, &m);
            err = TIFFReadDirEntryCheckRangeSshortShort(m);
            if (err != TIFFReadDirEntryErrOk)
                return (err);
            *value = (uint16_t)m;
            return (TIFFReadDirEntryErrOk);
        }
        case TIFF_SSHORT:
            TIFFReadDirEntryCheckedSshort(tif, direntry, value);
            return (TIFFReadDirEntryErrOk);
        case TIFF_LONG:
        {
            uint32_t m;
            TIFFReadDirEntryCheckedLong(tif, direntry, &m);
            err = TIFFReadDirEntryCheckRangeSshortLong(m);
            if (err != TIFFReadDirEntryErrOk)
                return (err);
            *value = (int16_t)m;
            return (TIFFReadDirEntryErrOk);
        }
        case TIFF_SLONG:
        {
            int32_t m;
            TIFFReadDirEntryCheckedSlong(tif, direntry, &m);
            err = TIFFReadDirEntryCheckRangeSshortSlong(m);
            if (err != TIFFReadDirEntryErrOk)
                return (err);
            *value = (int16_t)m;
            return (TIFFReadDirEntryErrOk);
        }
        case TIFF_LONG8:
        {
            uint64_t m;
            err = TIFFReadDirEntryCheckedLong8(tif, direntry, &m);
            if (err != TIFFReadDirEntryErrOk)
                return (err);
            err = TIFFReadDirEntryCheckRangeSshortLong8(m);
            if (err != TIFFReadDirEntryErrOk)
                return (err);
            *value = (int16_t)m;
            return (TIFFReadDirEntryErrOk);
        }
        case TIFF_SLONG8:
        {
            int64_t m;
            err = TIFFReadDirEntryCheckedSlong8(tif, direntry, &m);
            if (err != TIFFReadDirEntryErrOk)
                return (err);
            err = TIFFReadDirEntryCheckRangeSshortSlong8(m);
            if (err != TIFFReadDirEntryErrOk)
                return (err);
            *value = (int16_t)m;
            return (TIFFReadDirEntryErrOk);
        }
        default:
            return (TIFFReadDirEntryErrType);
    }
}